

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O3

void Imf_3_4::RgbaYca::reconstructChromaVert(int n,Rgba **ycaIn,Rgba *ycaOut)

{
  Rgba *pRVar1;
  Rgba *pRVar2;
  Rgba *pRVar3;
  Rgba *pRVar4;
  Rgba *pRVar5;
  Rgba *pRVar6;
  Rgba *pRVar7;
  Rgba *pRVar8;
  Rgba *pRVar9;
  Rgba *pRVar10;
  Rgba *pRVar11;
  Rgba *pRVar12;
  Rgba *pRVar13;
  Rgba *pRVar14;
  Rgba *pRVar15;
  char cVar16;
  long lVar17;
  float fVar18;
  long lVar19;
  ushort uVar20;
  uint uVar21;
  float fVar22;
  
  lVar17 = _imath_half_to_float_table;
  if (0 < n) {
    pRVar1 = *ycaIn;
    pRVar2 = ycaIn[2];
    pRVar3 = ycaIn[4];
    pRVar4 = ycaIn[6];
    pRVar5 = ycaIn[8];
    pRVar6 = ycaIn[10];
    pRVar7 = ycaIn[0xc];
    pRVar8 = ycaIn[0xe];
    pRVar9 = ycaIn[0x10];
    pRVar10 = ycaIn[0x12];
    pRVar11 = ycaIn[0x14];
    pRVar12 = ycaIn[0x16];
    pRVar13 = ycaIn[0x18];
    pRVar14 = ycaIn[0x1a];
    pRVar15 = ycaIn[0xd];
    lVar19 = 0;
    do {
      fVar22 = *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar14->r)._h + lVar19) * 4) *
               0.002128 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar13->r)._h + lVar19) * 4) *
               -0.00754 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar12->r)._h + lVar19) * 4) *
               0.019597 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar11->r)._h + lVar19) * 4) *
               -0.043159 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar10->r)._h + lVar19) * 4) *
               0.087929 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar9->r)._h + lVar19) * 4) *
               -0.186077 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar8->r)._h + lVar19) * 4) *
               0.627123 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar7->r)._h + lVar19) * 4) *
               0.627123 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar6->r)._h + lVar19) * 4) *
               -0.186077 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar5->r)._h + lVar19) * 4) *
               0.087929 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar4->r)._h + lVar19) * 4) *
               -0.043159 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar3->r)._h + lVar19) * 4) *
               0.019597 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar1->r)._h + lVar19) * 4) *
               0.002128 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar2->r)._h + lVar19) * 4) *
               -0.00754;
      fVar18 = ABS(fVar22);
      uVar20 = (ushort)((uint)fVar22 >> 0x10) & 0x8000;
      if ((uint)fVar18 < 0x38800000) {
        if ((0x33000000 < (uint)fVar18) &&
           (uVar21 = (uint)fVar18 & 0x7fffff | 0x800000, cVar16 = (char)((uint)fVar18 >> 0x17),
           uVar20 = uVar20 | (ushort)(uVar21 >> (0x7eU - cVar16 & 0x1f)),
           0x80000000 < uVar21 << (cVar16 + 0xa2U & 0x1f))) {
          uVar20 = uVar20 + 1;
        }
      }
      else if ((uint)fVar18 < 0x7f800000) {
        if ((uint)fVar18 < 0x477ff000) {
          uVar20 = (ushort)((int)fVar18 + 0x8000fff + (uint)(((uint)fVar18 >> 0xd & 1) != 0) >> 0xd)
                   | uVar20;
        }
        else {
          uVar20 = uVar20 | 0x7c00;
        }
      }
      else {
        uVar20 = uVar20 | 0x7c00;
        if (fVar18 != INFINITY) {
          uVar21 = (uint)fVar18 >> 0xd & 0x3ff;
          uVar20 = uVar20 | (ushort)uVar21 | (ushort)(uVar21 == 0);
        }
      }
      *(ushort *)((long)&(ycaOut->r)._h + lVar19) = uVar20;
      fVar22 = *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar14->b)._h + lVar19) * 4) *
               0.002128 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar13->b)._h + lVar19) * 4) *
               -0.00754 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar12->b)._h + lVar19) * 4) *
               0.019597 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar11->b)._h + lVar19) * 4) *
               -0.043159 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar10->b)._h + lVar19) * 4) *
               0.087929 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar9->b)._h + lVar19) * 4) *
               -0.186077 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar8->b)._h + lVar19) * 4) *
               0.627123 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar7->b)._h + lVar19) * 4) *
               0.627123 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar6->b)._h + lVar19) * 4) *
               -0.186077 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar5->b)._h + lVar19) * 4) *
               0.087929 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar4->b)._h + lVar19) * 4) *
               -0.043159 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar3->b)._h + lVar19) * 4) *
               0.019597 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar1->b)._h + lVar19) * 4) *
               0.002128 +
               *(float *)(lVar17 + (ulong)*(ushort *)((long)&(pRVar2->b)._h + lVar19) * 4) *
               -0.00754;
      fVar18 = ABS(fVar22);
      uVar20 = (ushort)((uint)fVar22 >> 0x10) & 0x8000;
      if ((uint)fVar18 < 0x38800000) {
        if ((0x33000000 < (uint)fVar18) &&
           (uVar21 = (uint)fVar18 & 0x7fffff | 0x800000, cVar16 = (char)((uint)fVar18 >> 0x17),
           uVar20 = uVar20 | (ushort)(uVar21 >> (0x7eU - cVar16 & 0x1f)),
           0x80000000 < uVar21 << (cVar16 + 0xa2U & 0x1f))) {
          uVar20 = uVar20 + 1;
        }
      }
      else if ((uint)fVar18 < 0x7f800000) {
        if ((uint)fVar18 < 0x477ff000) {
          uVar20 = (ushort)((int)fVar18 + 0x8000fff + (uint)(((uint)fVar18 >> 0xd & 1) != 0) >> 0xd)
                   | uVar20;
        }
        else {
          uVar20 = uVar20 | 0x7c00;
        }
      }
      else {
        uVar20 = uVar20 | 0x7c00;
        if (fVar18 != INFINITY) {
          uVar21 = (uint)fVar18 >> 0xd & 0x3ff;
          uVar20 = uVar20 | (ushort)uVar21 | (ushort)(uVar21 == 0);
        }
      }
      *(ushort *)((long)&(ycaOut->b)._h + lVar19) = uVar20;
      *(undefined2 *)((long)&(ycaOut->g)._h + lVar19) =
           *(undefined2 *)((long)&(pRVar15->g)._h + lVar19);
      *(undefined2 *)((long)&(ycaOut->a)._h + lVar19) =
           *(undefined2 *)((long)&(pRVar15->a)._h + lVar19);
      lVar19 = lVar19 + 8;
    } while ((ulong)(uint)n << 3 != lVar19);
  }
  return;
}

Assistant:

void
reconstructChromaVert (int n, const Rgba* const ycaIn[N], Rgba ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
        ycaOut[i].r = ycaIn[0][i].r * 0.002128f + ycaIn[2][i].r * -0.007540f +
                      ycaIn[4][i].r * 0.019597f + ycaIn[6][i].r * -0.043159f +
                      ycaIn[8][i].r * 0.087929f + ycaIn[10][i].r * -0.186077f +
                      ycaIn[12][i].r * 0.627123f + ycaIn[14][i].r * 0.627123f +
                      ycaIn[16][i].r * -0.186077f + ycaIn[18][i].r * 0.087929f +
                      ycaIn[20][i].r * -0.043159f + ycaIn[22][i].r * 0.019597f +
                      ycaIn[24][i].r * -0.007540f + ycaIn[26][i].r * 0.002128f;

        ycaOut[i].b = ycaIn[0][i].b * 0.002128f + ycaIn[2][i].b * -0.007540f +
                      ycaIn[4][i].b * 0.019597f + ycaIn[6][i].b * -0.043159f +
                      ycaIn[8][i].b * 0.087929f + ycaIn[10][i].b * -0.186077f +
                      ycaIn[12][i].b * 0.627123f + ycaIn[14][i].b * 0.627123f +
                      ycaIn[16][i].b * -0.186077f + ycaIn[18][i].b * 0.087929f +
                      ycaIn[20][i].b * -0.043159f + ycaIn[22][i].b * 0.019597f +
                      ycaIn[24][i].b * -0.007540f + ycaIn[26][i].b * 0.002128f;

        ycaOut[i].g = ycaIn[13][i].g;
        ycaOut[i].a = ycaIn[13][i].a;
    }
}